

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lar2par.cc
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  size_t sVar4;
  string *this;
  char *__s;
  long lVar5;
  bool bVar6;
  int num_order;
  LogAreaRatioToParcorCoefficients log_area_ratio_to_parcor_coefficients;
  vector<double,_std::allocator<double>_> coefficients;
  ostringstream error_message_3;
  ifstream ifs;
  int local_3fc;
  string local_3f8;
  LogAreaRatioToParcorCoefficients local_3d8;
  vector<double,_std::allocator<double>_> local_3c8;
  string local_3b0 [3];
  ios_base local_340 [264];
  string local_238;
  byte abStack_218 [80];
  ios_base local_1c8 [408];
  
  local_3fc = 0x19;
  while (iVar3 = ya_getopt_long(argc,argv,"m:h",(option *)0x0,(int *)0x0), iVar3 == 0x6d) {
    std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3b0);
    bVar1 = sptk::ConvertStringToInteger(&local_238,&local_3fc);
    bVar6 = local_3fc < 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p);
    }
    if (!bVar1 || bVar6) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"The argument for the -m option must be a ",0x29);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"non-negative integer",0x14);
      local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"lar2par","");
      sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
LAB_00103997:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0[0]._M_dataplus._M_p != &local_3b0[0].field_2) {
        operator_delete(local_3b0[0]._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
      std::ios_base::~ios_base(local_1c8);
      return 1;
    }
  }
  if (iVar3 != -1) {
    if (iVar3 != 0x68) {
      anon_unknown.dwarf_2bae::PrintUsage((ostream *)&std::cerr);
      return 1;
    }
    anon_unknown.dwarf_2bae::PrintUsage((ostream *)&std::cout);
    return 0;
  }
  if (1 < argc - ya_optind) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_238,"Too many input files",0x14);
    local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"lar2par","");
    sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
    goto LAB_00103997;
  }
  if (argc == ya_optind) {
    __s = (char *)0x0;
  }
  else {
    __s = argv[ya_optind];
  }
  bVar1 = sptk::SetBinaryMode();
  this = &local_238;
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this,"Cannot set translation mode",0x1b);
    local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"lar2par","");
    sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
    goto LAB_00103997;
  }
  std::ifstream::ifstream(this);
  if ((__s == (char *)0x0) ||
     (std::ifstream::open((char *)&local_238,(_Ios_Openmode)__s),
     (abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) == 0)) {
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      this = (string *)&std::cin;
    }
    sptk::LogAreaRatioToParcorCoefficients::LogAreaRatioToParcorCoefficients(&local_3d8,local_3fc);
    if (local_3d8.is_valid_ != false) {
      lVar5 = (long)local_3fc;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_3c8,lVar5 + 1U,(allocator_type *)local_3b0);
      do {
        iVar3 = (int)(lVar5 + 1U);
        bVar1 = sptk::ReadStream<double>(false,0,0,iVar3,&local_3c8,(istream *)this,(int *)0x0);
        if (!bVar1) {
          iVar3 = 0;
          goto LAB_00103bef;
        }
        bVar1 = sptk::LogAreaRatioToParcorCoefficients::Run(&local_3d8,&local_3c8);
        if (!bVar1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3b0,"Failed to convert log area ratio to PARCOR coefficients",
                     0x37);
          local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"lar2par","");
          sptk::PrintErrorMessage(&local_3f8,(ostringstream *)local_3b0);
          goto LAB_00103bbd;
        }
        bVar1 = sptk::WriteStream<double>(0,iVar3,&local_3c8,(ostream *)&std::cout,(int *)0x0);
      } while (bVar1);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3b0,"Failed to write PARCOR coefficients",0x23);
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"lar2par","");
      sptk::PrintErrorMessage(&local_3f8,(ostringstream *)local_3b0);
LAB_00103bbd:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
        operator_delete(local_3f8._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
      std::ios_base::~ios_base(local_340);
      iVar3 = 1;
LAB_00103bef:
      if (local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      goto LAB_00103bfe;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3b0,"Failed to initialize LogAreaRatioToParcorCoefficients",0x35);
    local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"lar2par","");
    sptk::PrintErrorMessage(&local_3f8,(ostringstream *)local_3b0);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3b0,"Cannot open file ",0x11);
    sVar4 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b0,__s,sVar4);
    local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"lar2par","");
    sptk::PrintErrorMessage(&local_3f8,(ostringstream *)local_3b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
  std::ios_base::~ios_base(local_340);
  iVar3 = 1;
LAB_00103bfe:
  std::ifstream::~ifstream(&local_238);
  return iVar3;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_order(kDefaultNumOrder);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "m:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("lar2par", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("lar2par", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("lar2par", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("lar2par", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::LogAreaRatioToParcorCoefficients log_area_ratio_to_parcor_coefficients(
      num_order);
  if (!log_area_ratio_to_parcor_coefficients.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize LogAreaRatioToParcorCoefficients";
    sptk::PrintErrorMessage("lar2par", error_message);
    return 1;
  }

  const int length(num_order + 1);
  std::vector<double> coefficients(length);

  while (sptk::ReadStream(false, 0, 0, length, &coefficients, &input_stream,
                          NULL)) {
    if (!log_area_ratio_to_parcor_coefficients.Run(&coefficients)) {
      std::ostringstream error_message;
      error_message
          << "Failed to convert log area ratio to PARCOR coefficients";
      sptk::PrintErrorMessage("lar2par", error_message);
      return 1;
    }

    if (!sptk::WriteStream(0, length, coefficients, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write PARCOR coefficients";
      sptk::PrintErrorMessage("lar2par", error_message);
      return 1;
    }
  }

  return 0;
}